

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPAllocatorClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPAllocatorClause *this)

{
  bool bVar1;
  ulong uVar2;
  string local_b8;
  string local_98;
  string local_78;
  OpenMPAllocatorClauseAllocator local_58;
  allocator<char> local_51;
  OpenMPAllocatorClauseAllocator allocator;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPAllocatorClause *local_18;
  OpenMPAllocatorClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPAllocatorClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"allocator ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&allocator,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getAllocator(this);
  switch(local_58) {
  case OMPC_ALLOCATOR_ALLOCATOR_default:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_default_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_large_cap:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_large_cap_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_cons_mem:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_const_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_high_bw:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_high_bw_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_low_lat:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_low_lat_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_cgroup:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_cgroup_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_pteam:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_pteam_mem_alloc");
    break;
  case OMPC_ALLOCATOR_ALLOCATOR_thread:
    std::__cxx11::string::operator+=((string *)&allocator,"omp_thread_mem_alloc");
  }
  getUserDefinedAllocator_abi_cxx11_(&local_78,this);
  bVar1 = std::operator!=(&local_78,"");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    getUserDefinedAllocator_abi_cxx11_(&local_98,this);
    std::__cxx11::string::operator+=((string *)&allocator,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_b8,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&allocator,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::operator+=((string *)&allocator,") ");
  uVar2 = std::__cxx11::string::size();
  if (2 < uVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&allocator);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&allocator);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAllocatorClause::toString() {

    std::string result = "allocator ";
    std::string clause_string = "(";
    OpenMPAllocatorClauseAllocator allocator = this->getAllocator();
    switch (allocator) {
        case OMPC_ALLOCATOR_ALLOCATOR_default:
            clause_string += "omp_default_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_large_cap:
            clause_string += "omp_large_cap_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_cons_mem:
            clause_string += "omp_const_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_high_bw:
            clause_string += "omp_high_bw_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_low_lat:
            clause_string += "omp_low_lat_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_cgroup:
            clause_string += "omp_cgroup_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_pteam:
            clause_string += "omp_pteam_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_thread:
            clause_string += "omp_thread_mem_alloc";
            break;
        default:
            ;
    }
   if (this->getUserDefinedAllocator() != ""){
        clause_string += this->getUserDefinedAllocator();
    }
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 2) {
        result += clause_string;
    };


    return result;
}